

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS.h
# Opt level: O2

__type * __thiscall
NS::wrap<NS*,NS*,NS*>(__type *__return_storage_ptr__,NS *this,NS *first,NS *rest,NS *rest_1)

{
  undefined1 local_50 [16];
  N *pNStack_40;
  
  wrap<NS*>((NS *)local_50,this);
  wrap<NS*,NS*>((NS *)(local_50 + 8),this,rest);
  (__return_storage_ptr__->super__Tuple_impl<0UL,_N_*,_N_*,_N_*>).super__Tuple_impl<1UL,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl = (N *)local_50._8_8_;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_N_*,_N_*,_N_*>).super__Tuple_impl<1UL,_N_*,_N_*>.
  super__Head_base<1UL,_N_*,_false>._M_head_impl = pNStack_40;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_N_*,_N_*,_N_*>).super__Head_base<0UL,_N_*,_false>.
  _M_head_impl = (N *)local_50._0_8_;
  return __return_storage_ptr__;
}

Assistant:

auto wrap(DataType first, Args  ... rest) {
        return std::tuple_cat(wrap(first), wrap(rest...));
    }